

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::copy
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  undefined8 uVar2;
  byte *pbVar3;
  byte *pbVar4;
  pointer pIVar5;
  byte *pbVar6;
  pointer pIVar7;
  byte *pbVar8;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar6 = pbVar3 + sVar1 * 0x18;
  if (*(byte **)(dst + 8) < pbVar6) {
    pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x18,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_004b3258;
    pIVar5 = this->data_;
    pIVar7 = pIVar5 + sVar1;
    pbVar6 = pbVar4 + sVar1 * 0x18;
    pbVar3 = pbVar4;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar6;
    pIVar5 = this->data_;
    pIVar7 = pIVar5 + sVar1;
    pbVar4 = pbVar3;
  }
  do {
    pbVar8 = pbVar3 + 0x18;
    *(AssertionExpr **)(pbVar3 + 0x10) = (pIVar5->body).ptr;
    uVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
    *(pointer *)pbVar3 = (pIVar5->expressions)._M_ptr;
    *(undefined8 *)(pbVar3 + 8) = uVar2;
    if (pIVar5 + 1 == pIVar7) break;
    pIVar5 = pIVar5 + 1;
    pbVar3 = pbVar8;
  } while (pbVar8 != pbVar6);
LAB_004b3258:
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }